

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

EVP_PKEY_CTX * evp_pkey_ctx_new(EVP_PKEY *pkey,ENGINE *e,EVP_PKEY_METHOD *pmeth)

{
  int iVar1;
  EVP_PKEY_CTX *ret;
  EVP_PKEY_METHOD *pmeth_local;
  ENGINE *e_local;
  EVP_PKEY *pkey_local;
  
  pkey_local = (EVP_PKEY *)OPENSSL_zalloc(0x30);
  if ((EVP_PKEY_CTX *)pkey_local == (EVP_PKEY_CTX *)0x0) {
    pkey_local = (EVP_PKEY *)0x0;
  }
  else {
    ((EVP_PKEY_CTX *)pkey_local)->engine = e;
    ((EVP_PKEY_CTX *)pkey_local)->pmeth = pmeth;
    ((EVP_PKEY_CTX *)pkey_local)->operation = 0;
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_up_ref(pkey);
      ((EVP_PKEY_CTX *)pkey_local)->pkey = pkey;
    }
    if ((pmeth->init != (_func_int_EVP_PKEY_CTX_ptr *)0x0) &&
       (iVar1 = (*pmeth->init)((EVP_PKEY_CTX *)pkey_local), iVar1 < 1)) {
      EVP_PKEY_free((EVP_PKEY *)((EVP_PKEY_CTX *)pkey_local)->pkey);
      OPENSSL_free(pkey_local);
      pkey_local = (EVP_PKEY *)0x0;
    }
  }
  return (EVP_PKEY_CTX *)pkey_local;
}

Assistant:

static EVP_PKEY_CTX *evp_pkey_ctx_new(EVP_PKEY *pkey, ENGINE *e,
                                      const EVP_PKEY_METHOD *pmeth) {
  EVP_PKEY_CTX *ret =
      reinterpret_cast<EVP_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EVP_PKEY_CTX)));
  if (!ret) {
    return NULL;
  }

  ret->engine = e;
  ret->pmeth = pmeth;
  ret->operation = EVP_PKEY_OP_UNDEFINED;

  if (pkey) {
    EVP_PKEY_up_ref(pkey);
    ret->pkey = pkey;
  }

  if (pmeth->init) {
    if (pmeth->init(ret) <= 0) {
      EVP_PKEY_free(ret->pkey);
      OPENSSL_free(ret);
      return NULL;
    }
  }

  return ret;
}